

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

string * __thiscall
FilenameBuilder::build
          (string *__return_storage_ptr__,FilenameBuilder *this,string *pattern,string *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  long *plVar4;
  tm *__tp;
  size_t sVar5;
  size_type *psVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  array<char,_128UL> tsbuf;
  _Any_data local_110;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [4];
  string local_68;
  __time_t local_48;
  __syscall_slong_t _Stack_40;
  
  local_f0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f0;
  pcVar2 = (pattern->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pattern->_M_string_length);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1afb77);
  }
  sVar3 = (this->dir)._M_string_length;
  if (sVar3 == 0) {
    std::operator+(local_e8,"./",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_e8);
    uVar7 = local_e8[0].field_2._M_allocated_capacity;
    uVar8 = local_e8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8[0]._M_dataplus._M_p == &local_e8[0].field_2) goto LAB_0016789e;
  }
  else {
    pcVar2 = (this->dir)._M_dataplus._M_p;
    local_110._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_100;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,pcVar2,pcVar2 + sVar3);
    std::__cxx11::string::append(local_110._M_pod_data);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (local_110._M_pod_data,
                                (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e8[0].field_2._0_8_ = *psVar6;
      local_e8[0].field_2._8_8_ = plVar4[3];
      local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
    }
    else {
      local_e8[0].field_2._0_8_ = *psVar6;
      local_e8[0]._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8[0]._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
      operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_100._0_8_;
    uVar8 = local_110._M_unused._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_unused._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100) goto LAB_0016789e;
  }
  operator_delete((void *)uVar8,uVar7 + 1);
LAB_0016789e:
  if (extension->_M_string_length != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_110._M_unused._M_object = local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::append(local_110._M_pod_data);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (local_110._M_pod_data,(ulong)(extension->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e8[0].field_2._0_8_ = *psVar6;
      local_e8[0].field_2._8_8_ = plVar4[3];
      local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
    }
    else {
      local_e8[0].field_2._0_8_ = *psVar6;
      local_e8[0]._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8[0]._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
      operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_110._M_unused._0_8_ != local_100) {
      operator_delete(local_110._M_unused._M_object,local_100._0_8_ + 1);
    }
  }
  local_110._M_unused._M_object = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"%t","");
  local_48 = (this->time).tv_sec;
  _Stack_40 = (this->time).tv_nsec;
  __tp = gmtime(&local_48);
  sVar5 = strftime((char *)local_e8,0x80,"%Y%m%d-%H%M%S",__tp);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,local_e8,(long)&local_e8[0]._M_dataplus._M_p + sVar5);
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,(string *)&local_110,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_110._M_unused._0_8_ != local_100) {
    operator_delete(local_110._M_unused._M_object,local_100._0_8_ + 1);
  }
  paVar1 = &local_e8[0].field_2;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"{filename}","");
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,local_e8,&this->filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_e8[0]._M_string_length = 4;
  local_e8[0].field_2._0_5_ = 0x656d6974;
  local_110._8_8_ = 0;
  local_100._8_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:91:24)>
       ::_M_invoke;
  local_100._0_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:91:24)>
       ::_M_manager;
  local_110._M_unused._M_object = &this->time;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,local_e8,(subst *)&local_110);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(&local_110,&local_110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_110._M_unused._M_object = &this->awips;
  local_e8[0].field_2._0_6_ = 0x7370697761;
  local_e8[0]._M_string_length = 5;
  local_110._8_8_ = 0;
  local_100._8_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:64:25)>
       ::_M_invoke;
  local_100._0_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:64:25)>
       ::_M_manager;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,local_e8,(subst *)&local_110);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(&local_110,&local_110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_110._M_unused._M_object = &this->product;
  local_e8[0]._M_string_length = 7;
  local_e8[0].field_2._M_allocated_capacity = 0x746375646f7270;
  local_110._8_8_ = 0;
  local_100._8_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:103:27)>
       ::_M_invoke;
  local_100._0_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:103:27)>
       ::_M_manager;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,local_e8,(subst *)&local_110);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(&local_110,&local_110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_110._M_unused._M_object = &this->region;
  local_e8[0]._M_string_length = 6;
  local_e8[0].field_2._0_7_ = 0x6e6f69676572;
  local_110._8_8_ = 0;
  local_100._8_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:114:26)>
       ::_M_invoke;
  local_100._0_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:114:26)>
       ::_M_manager;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,local_e8,(subst *)&local_110);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(&local_110,&local_110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_110._M_unused._M_object = &this->channel;
  local_e8[0]._M_string_length = 7;
  local_e8[0].field_2._M_allocated_capacity = 0x6c656e6e616863;
  local_110._8_8_ = 0;
  local_100._8_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:125:27)>
       ::_M_invoke;
  local_100._0_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/filename.cc:125:27)>
       ::_M_manager;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown.dwarf_71875::replace(__return_storage_ptr__,local_e8,(subst *)&local_110);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(&local_110,&local_110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameBuilder::build(
    const std::string& pattern,
    const std::string extension) const {
  std::string out = pattern;

  // Default pattern to passing through the original filename
  if (out.empty()) {
    out = "{filename}";
  }

  // Prefix directory if set
  if (!dir.empty()) {
    out = dir + "/" + out;
  } else {
    out = "./" + out;
  }

  // Append extension if set
  if (!extension.empty()) {
    out = out + "." + extension;
  }

  // %t: Date and time (ISO 8601)
  replace(out, "%t", toISO8601(time));

  // Replace {filename}
  replace(out, "{filename}", filename);

  // Replace {time:FORMAT}
  replace(out, time);

  // Replace {awips:XXX}
  replace(out, awips);

  // Replace {product:XXX}
  replace(out, product);

  // Replace {region:XXX}
  replace(out, region);

  // Replace {channel:XXX}
  replace(out, channel);

  return out;
}